

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O2

void cmSourceFileSetName(void *arg,char *name,char *dir,int numSourceExtensions,
                        char **sourceExtensions,int numHeaderExtensions,char **headerExtensions)

{
  string *this;
  void *pvVar1;
  pointer pbVar2;
  long lVar3;
  ostream *poVar4;
  string *ext;
  ulong uVar5;
  pointer pbVar6;
  pointer pbVar7;
  bool bVar8;
  allocator<char> local_251;
  void *local_250;
  string local_248;
  string hname;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headerExts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sourceExts;
  string pathname;
  ostringstream e;
  
  if (*arg == 0) {
    sourceExts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    sourceExts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    sourceExts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    headerExts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    headerExts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    headerExts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar5 = 0;
    local_250 = arg;
    if (0 < numSourceExtensions) {
      uVar5 = (ulong)(uint)numSourceExtensions;
    }
    while (pvVar1 = local_250, bVar8 = uVar5 != 0, uVar5 = uVar5 - 1, bVar8) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&sourceExts,
                 sourceExtensions);
      sourceExtensions = sourceExtensions + 1;
    }
    uVar5 = 0;
    if (0 < numHeaderExtensions) {
      uVar5 = (ulong)(uint)numHeaderExtensions;
    }
    while (bVar8 = uVar5 != 0, uVar5 = uVar5 - 1, bVar8) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&headerExts,
                 headerExtensions);
      headerExtensions = headerExtensions + 1;
    }
    this = (string *)((long)pvVar1 + 8);
    std::__cxx11::string::assign((char *)this);
    std::__cxx11::string::string<std::allocator<char>>((string *)&e,name,(allocator<char> *)&hname);
    cmsys::SystemTools::CollapseFullPath(&pathname,(string *)&e,dir);
    std::__cxx11::string::~string((string *)&e);
    std::__cxx11::string::string((string *)&hname,(string *)&pathname);
    bVar8 = cmsys::SystemTools::FileExists(&hname);
    pbVar7 = sourceExts.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (bVar8) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,name,&local_251);
      cmsys::SystemTools::GetFilenamePath((string *)&e,&local_248);
      std::__cxx11::string::operator=(this,(string *)&e);
      std::__cxx11::string::~string((string *)&e);
      std::__cxx11::string::~string((string *)&local_248);
      if (*(long *)((long)pvVar1 + 0x10) != 0) {
        std::__cxx11::string::append((char *)this);
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,name,&local_251);
      cmsys::SystemTools::GetFilenameWithoutLastExtension((string *)&e,&local_248);
      std::__cxx11::string::append(this);
      std::__cxx11::string::~string((string *)&e);
      std::__cxx11::string::~string((string *)&local_248);
      lVar3 = std::__cxx11::string::rfind((char)&hname,0x2e);
      if (lVar3 != -1) {
        std::__cxx11::string::substr((ulong)&e,(ulong)&hname);
        std::__cxx11::string::operator=((string *)((long)pvVar1 + 0x28),(string *)&e);
        std::__cxx11::string::~string((string *)&e);
        bVar8 = cmsys::SystemTools::FileIsFullPath(name);
        if (bVar8) {
          lVar3 = std::__cxx11::string::rfind((char)&hname,0x2f);
          if (lVar3 != -1) {
            std::__cxx11::string::substr((ulong)&e,(ulong)&hname);
            std::__cxx11::string::operator=(this,(string *)&e);
            std::__cxx11::string::~string((string *)&e);
          }
        }
      }
      std::__cxx11::string::_M_assign((string *)((long)pvVar1 + 0x48));
    }
    else {
      for (pbVar6 = sourceExts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar2 = headerExts.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish, pbVar6 != pbVar7; pbVar6 = pbVar6 + 1
          ) {
        local_248._M_dataplus._M_p._0_1_ = 0x2e;
        cmStrCat<std::__cxx11::string&,char,std::__cxx11::string_const&>
                  ((string *)&e,&pathname,(char *)&local_248,pbVar6);
        std::__cxx11::string::operator=((string *)&hname,(string *)&e);
        std::__cxx11::string::~string((string *)&e);
        bVar8 = cmsys::SystemTools::FileExists(&hname);
        pvVar1 = local_250;
        if (bVar8) {
          std::__cxx11::string::_M_assign((string *)((long)local_250 + 0x28));
          std::__cxx11::string::_M_assign((string *)((long)pvVar1 + 0x48));
          goto LAB_003771ed;
        }
      }
      for (pbVar7 = headerExts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar2; pbVar7 = pbVar7 + 1
          ) {
        local_248._M_dataplus._M_p._0_1_ = 0x2e;
        cmStrCat<std::__cxx11::string&,char,std::__cxx11::string_const&>
                  ((string *)&e,&pathname,(char *)&local_248,pbVar7);
        std::__cxx11::string::operator=((string *)&hname,(string *)&e);
        std::__cxx11::string::~string((string *)&e);
        bVar8 = cmsys::SystemTools::FileExists(&hname);
        pvVar1 = local_250;
        if (bVar8) {
          std::__cxx11::string::_M_assign((string *)((long)local_250 + 0x28));
          std::__cxx11::string::_M_assign((string *)((long)pvVar1 + 0x48));
          goto LAB_003771ed;
        }
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar4 = std::operator<<((ostream *)&e,"Cannot find source file \"");
      poVar4 = std::operator<<(poVar4,(string *)&pathname);
      std::operator<<(poVar4,"\"");
      std::operator<<((ostream *)&e,"\n\nTried extensions");
      pbVar7 = sourceExts.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar6 = sourceExts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar2 = headerExts.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish, pbVar6 != pbVar7; pbVar6 = pbVar6 + 1
          ) {
        poVar4 = std::operator<<((ostream *)&e," .");
        std::operator<<(poVar4,(string *)pbVar6);
      }
      for (pbVar7 = headerExts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar2; pbVar7 = pbVar7 + 1
          ) {
        poVar4 = std::operator<<((ostream *)&e," .");
        std::operator<<(poVar4,(string *)pbVar7);
      }
      std::__cxx11::stringbuf::str();
      cmSystemTools::Error(&local_248);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    }
LAB_003771ed:
    std::__cxx11::string::~string((string *)&hname);
    std::__cxx11::string::~string((string *)&pathname);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&headerExts);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&sourceExts);
  }
  return;
}

Assistant:

static void CCONV cmSourceFileSetName(void* arg, const char* name,
                                      const char* dir, int numSourceExtensions,
                                      const char** sourceExtensions,
                                      int numHeaderExtensions,
                                      const char** headerExtensions)
{
  cmCPluginAPISourceFile* sf = static_cast<cmCPluginAPISourceFile*>(arg);
  if (sf->RealSourceFile) {
    // SetName is allowed only on temporary source files created by
    // the command for building and passing to AddSource.
    return;
  }
  std::vector<std::string> sourceExts;
  std::vector<std::string> headerExts;
  int i;
  for (i = 0; i < numSourceExtensions; ++i) {
    sourceExts.emplace_back(sourceExtensions[i]);
  }
  for (i = 0; i < numHeaderExtensions; ++i) {
    headerExts.emplace_back(headerExtensions[i]);
  }

  // Save the original name given.
  sf->SourceName = name;

  // Convert the name to a full path in case the given name is a
  // relative path.
  std::string pathname = cmSystemTools::CollapseFullPath(name, dir);

  // First try and see whether the listed file can be found
  // as is without extensions added on.
  std::string hname = pathname;
  if (cmSystemTools::FileExists(hname)) {
    sf->SourceName = cmSystemTools::GetFilenamePath(name);
    if (!sf->SourceName.empty()) {
      sf->SourceName += "/";
    }
    sf->SourceName += cmSystemTools::GetFilenameWithoutLastExtension(name);
    std::string::size_type pos = hname.rfind('.');
    if (pos != std::string::npos) {
      sf->SourceExtension = hname.substr(pos + 1, hname.size() - pos);
      if (cmSystemTools::FileIsFullPath(name)) {
        std::string::size_type pos2 = hname.rfind('/');
        if (pos2 != std::string::npos) {
          sf->SourceName = hname.substr(pos2 + 1, pos - pos2 - 1);
        }
      }
    }

    sf->FullPath = hname;
    return;
  }

  // Next, try the various source extensions
  for (std::string const& ext : sourceExts) {
    hname = cmStrCat(pathname, '.', ext);
    if (cmSystemTools::FileExists(hname)) {
      sf->SourceExtension = ext;
      sf->FullPath = hname;
      return;
    }
  }

  // Finally, try the various header extensions
  for (std::string const& ext : headerExts) {
    hname = cmStrCat(pathname, '.', ext);
    if (cmSystemTools::FileExists(hname)) {
      sf->SourceExtension = ext;
      sf->FullPath = hname;
      return;
    }
  }

  std::ostringstream e;
  e << "Cannot find source file \"" << pathname << "\"";
  e << "\n\nTried extensions";
  for (std::string const& ext : sourceExts) {
    e << " ." << ext;
  }
  for (std::string const& ext : headerExts) {
    e << " ." << ext;
  }
  cmSystemTools::Error(e.str());
}